

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O1

ChannelList *
Imf_3_4::channelInAllViews
          (ChannelList *__return_storage_ptr__,string *channelName,ChannelList *channelList,
          StringVector *multiView)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  ConstIterator CVar5;
  allocator<char> local_61;
  ChannelList *local_60;
  StringVector *local_58;
  string local_50;
  
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60 = __return_storage_ptr__;
  local_58 = multiView;
  cVar4._M_node = (_Base_ptr)ChannelList::begin(channelList);
  while( true ) {
    CVar5 = ChannelList::end(channelList);
    if ((const_iterator)cVar4._M_node == CVar5._i._M_node) break;
    iVar3 = std::__cxx11::string::compare((char *)channelName);
    if (iVar3 == 0) {
      bVar2 = true;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)(cVar4._M_node + 1),&local_61);
      bVar2 = areCounterparts(&local_50,channelName,local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar2 != false) {
      ChannelList::insert(local_60,(char *)(cVar4._M_node + 1),(Channel *)(cVar4._M_node + 9));
    }
    cVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar4._M_node);
  }
  return local_60;
}

Assistant:

ChannelList
channelInAllViews (
    const string&       channelName,
    const ChannelList&  channelList,
    const StringVector& multiView)
{
    //
    // Given the name of a channel, return a
    // list of the same channel in all views.
    //

    ChannelList q;

    for (ChannelList::ConstIterator i = channelList.begin ();
         i != channelList.end ();
         ++i)
    {
        if (i.name () == channelName ||
            areCounterparts (i.name (), channelName, multiView))
        {
            q.insert (i.name (), i.channel ());
        }
    }

    return q;
}